

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

Statistics * __thiscall
asmjit::v1_14::JitAllocator::statistics(Statistics *__return_storage_ptr__,JitAllocator *this)

{
  Impl *pIVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  JitAllocatorPrivateImpl *impl;
  bool bVar10;
  
  __return_storage_ptr__->_usedSize = 0;
  __return_storage_ptr__->_reservedSize = 0;
  __return_storage_ptr__->_overheadSize = 0;
  __return_storage_ptr__->_blockCount = 0;
  __return_storage_ptr__->_allocationCount = 0;
  pIVar1 = this->_impl;
  if (pIVar1 != (Impl *)JitAllocatorImpl_none) {
    pthread_mutex_lock((pthread_mutex_t *)(pIVar1 + 1));
    lVar5._0_4_ = pIVar1[5].granularity;
    lVar5._4_4_ = pIVar1[5].fillPattern;
    sVar3 = __return_storage_ptr__->_blockCount;
    sVar4 = __return_storage_ptr__->_usedSize;
    sVar7 = __return_storage_ptr__->_reservedSize;
    sVar6 = __return_storage_ptr__->_overheadSize;
    lVar8 = 0x40;
    while (bVar10 = lVar5 != 0, lVar5 = lVar5 + -1, bVar10) {
      lVar2 = *(long *)(pIVar1 + 5);
      sVar3 = sVar3 + *(uint *)(lVar2 + -0x28 + lVar8);
      uVar9 = (ulong)*(ushort *)(lVar2 + -0x24 + lVar8);
      sVar7 = sVar7 + (*(long *)(lVar2 + -0x18 + lVar8) + *(long *)(lVar2 + -0x20 + lVar8)) * uVar9;
      sVar4 = sVar4 + (*(long *)(lVar2 + -8 + lVar8) + *(long *)(lVar2 + -0x10 + lVar8)) * uVar9;
      sVar6 = sVar6 + *(long *)(lVar2 + lVar8);
      lVar8 = lVar8 + 0x48;
    }
    __return_storage_ptr__->_reservedSize = sVar7;
    __return_storage_ptr__->_usedSize = sVar4;
    __return_storage_ptr__->_overheadSize = sVar6;
    __return_storage_ptr__->_blockCount = sVar3;
    __return_storage_ptr__->_allocationCount = *(size_t *)(pIVar1 + 4);
    pthread_mutex_unlock((pthread_mutex_t *)(pIVar1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

JitAllocator::Statistics JitAllocator::statistics() const noexcept {
  Statistics statistics;
  statistics.reset();

  if (ASMJIT_LIKELY(_impl != &JitAllocatorImpl_none)) {
    JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
    LockGuard guard(impl->lock);

    size_t poolCount = impl->poolCount;
    for (size_t poolId = 0; poolId < poolCount; poolId++) {
      const JitAllocatorPool& pool = impl->pools[poolId];
      statistics._blockCount   += size_t(pool.blockCount);
      statistics._reservedSize += size_t(pool.totalAreaSize[0] + pool.totalAreaSize[1]) * pool.granularity;
      statistics._usedSize     += size_t(pool.totalAreaUsed[0] + pool.totalAreaUsed[1]) * pool.granularity;
      statistics._overheadSize += size_t(pool.totalOverheadBytes);
    }

    statistics._allocationCount = impl->allocationCount;
  }

  return statistics;
}